

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_queue.h
# Opt level: O3

bool __thiscall
webrtc::
SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>::
Insert(SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>
       *this,vector<short,_std::allocator<short>_> *input)

{
  pointer psVar1;
  pointer psVar2;
  size_t sVar3;
  pointer pvVar4;
  size_t sVar5;
  pointer psVar6;
  pointer psVar7;
  ulong uVar8;
  string *psVar9;
  ostream *poVar10;
  ulong uVar11;
  ulong uVar12;
  CritScope cs;
  CritScope CStack_1a8;
  FatalMessage local_1a0;
  
  if (input == (vector<short,_std::allocator<short>_> *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/swap_queue.h"
               ,0x79);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"Check failed: input",0x13);
    std::ios::widen((char)(ostream *)&local_1a0 + (char)*(undefined8 *)(local_1a0._0_8_ - 0x18));
    std::ostream::put((char)&local_1a0);
    poVar10 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"# ",2);
  }
  else {
    rtc::CritScope::CritScope(&CStack_1a8,&this->crit_queue_);
    psVar1 = (input->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
             super__Vector_impl_data._M_start;
    psVar2 = (input->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if ((this->queue_item_verifier_).minimum_capacity_ <= (ulong)((long)psVar2 - (long)psVar1 >> 1))
    {
      sVar3 = this->num_elements_;
      pvVar4 = (this->queue_).
               super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = ((long)(this->queue_).
                      super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) *
               -0x5555555555555555;
      if (sVar3 != uVar12) {
        sVar5 = this->next_write_index_;
        psVar6 = (input->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        psVar7 = *(pointer *)
                  ((long)&pvVar4[sVar5].super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data + 8);
        (input->super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data.
        _M_start = pvVar4[sVar5].super__Vector_base<short,_std::allocator<short>_>._M_impl.
                   super__Vector_impl_data._M_start;
        (input->super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data.
        _M_finish = psVar7;
        (input->super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             *(pointer *)
              ((long)&pvVar4[sVar5].super__Vector_base<short,_std::allocator<short>_>._M_impl.
                      super__Vector_impl_data + 0x10);
        pvVar4[sVar5].super__Vector_base<short,_std::allocator<short>_>._M_impl.
        super__Vector_impl_data._M_start = psVar1;
        *(pointer *)
         ((long)&pvVar4[sVar5].super__Vector_base<short,_std::allocator<short>_>._M_impl.
                 super__Vector_impl_data + 8) = psVar6;
        *(pointer *)
         ((long)&pvVar4[sVar5].super__Vector_base<short,_std::allocator<short>_>._M_impl.
                 super__Vector_impl_data + 0x10) = psVar2;
        uVar11 = 0;
        if (sVar5 + 1 != uVar12) {
          uVar11 = sVar5 + 1;
        }
        this->next_write_index_ = uVar11;
        uVar8 = sVar3 + 1;
        this->num_elements_ = uVar8;
        local_1a0._0_8_ = uVar12;
        if (uVar12 <= uVar11) {
          psVar9 = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                             (&this->next_write_index_,(unsigned_long *)&local_1a0,
                              "next_write_index_ < queue_.size()");
          if (psVar9 != (string *)0x0) {
            rtc::FatalMessage::FatalMessage
                      (&local_1a0,
                       "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/swap_queue.h"
                       ,0x8d,psVar9);
            goto LAB_0017bbd6;
          }
          uVar8 = this->num_elements_;
          local_1a0._0_8_ =
               ((long)(this->queue_).
                      super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->queue_).
                      super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        }
        if (((ulong)local_1a0._0_8_ < uVar8) &&
           (psVar9 = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                               (&this->num_elements_,(unsigned_long *)&local_1a0,
                                "num_elements_ <= queue_.size()"), psVar9 != (string *)0x0)) {
          rtc::FatalMessage::FatalMessage
                    (&local_1a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/swap_queue.h"
                     ,0x8e,psVar9);
          goto LAB_0017bbd6;
        }
      }
      rtc::CritScope::~CritScope(&CStack_1a8);
      return sVar3 != uVar12;
    }
    rtc::FatalMessage::FatalMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/swap_queue.h"
               ,0x7d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"Check failed: queue_item_verifier_(*input)",0x2a);
    std::ios::widen((char)(ostream *)&local_1a0 + (char)*(undefined8 *)(local_1a0._0_8_ - 0x18));
    std::ostream::put((char)&local_1a0);
    poVar10 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"# ",2);
  }
LAB_0017bbd6:
  rtc::FatalMessage::~FatalMessage(&local_1a0);
}

Assistant:

bool Insert(T* input) WARN_UNUSED_RESULT {
    RTC_DCHECK(input);

    rtc::CritScope cs(&crit_queue_);

    RTC_DCHECK(queue_item_verifier_(*input));

    if (num_elements_ == queue_.size()) {
      return false;
    }

    using std::swap;
    swap(*input, queue_[next_write_index_]);

    ++next_write_index_;
    if (next_write_index_ == queue_.size()) {
      next_write_index_ = 0;
    }

    ++num_elements_;

    RTC_DCHECK_LT(next_write_index_, queue_.size());
    RTC_DCHECK_LE(num_elements_, queue_.size());

    return true;
  }